

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gherkin_line.c
# Opt level: O2

wchar_t * GherkinLine_get_language(GherkinLine_conflict *line)

{
  _Bool _Var1;
  wchar_t *pwVar2;
  wchar_t *pwVar3;
  long lVar4;
  
  for (pwVar2 = line->trimmed_line; (*pwVar2 != L':' && (*pwVar2 != L'\0')); pwVar2 = pwVar2 + 1) {
  }
  do {
    pwVar3 = pwVar2;
    if (pwVar3[1] == L'\0') break;
    _Var1 = StringUtilities_is_whitespace(pwVar3[1]);
    pwVar2 = pwVar3 + 1;
  } while (_Var1);
  for (lVar4 = 0; pwVar3[lVar4 + 1] != L'\0'; lVar4 = lVar4 + 1) {
    _Var1 = StringUtilities_is_whitespace(pwVar3[lVar4 + 1]);
    if (_Var1) break;
  }
  pwVar2 = StringUtilities_copy_string_part(pwVar3 + 1,(wchar_t)lVar4);
  return pwVar2;
}

Assistant:

const wchar_t* GherkinLine_get_language(const GherkinLine* line) {
    const wchar_t* start = line->trimmed_line;
    while (*start != L'\0' && *start != L':')
        ++start;
    ++start;
    while (*start != L'\0' && StringUtilities_is_whitespace(*start))
        ++start;
    const wchar_t* end = start;
    while (*end != L'\0' && !StringUtilities_is_whitespace(*end))
        ++end;
    return StringUtilities_copy_string_part(start, end - start);
}